

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_gnutar.c
# Opt level: O0

int archive_write_gnutar_header(archive_write *a,archive_entry *entry)

{
  long *plVar1;
  size_t sVar2;
  void *buff_00;
  mode_t mVar3;
  wchar_t wVar4;
  int iVar5;
  archive_string_conv *paVar6;
  char *pcVar7;
  size_t sVar8;
  archive_string *paVar9;
  int *piVar10;
  char *pcVar11;
  archive_entry *paVar12;
  la_int64_t lVar13;
  archive_entry *temp_1;
  size_t todo_1;
  char *pathname;
  archive_entry *temp;
  size_t todo;
  archive_string as;
  size_t path_length;
  char *p;
  archive_entry *entry_main;
  archive_string_conv *sconv;
  gnutar *gnutar;
  int tartype;
  int ret2;
  int ret;
  int r;
  char buff [512];
  archive_entry *entry_local;
  archive_write *a_local;
  
  gnutar._4_4_ = 0;
  plVar1 = (long *)a->format_data;
  if (plVar1[10] == 0) {
    if ((int)plVar1[0xc] == 0) {
      paVar6 = archive_string_default_conversion_for_write(&a->archive);
      plVar1[0xb] = (long)paVar6;
      *(undefined4 *)(plVar1 + 0xc) = 1;
    }
    entry_main = (archive_entry *)plVar1[0xb];
  }
  else {
    entry_main = (archive_entry *)plVar1[10];
  }
  pcVar7 = archive_entry_hardlink(entry);
  if (((pcVar7 != (char *)0x0) || (pcVar7 = archive_entry_symlink(entry), pcVar7 != (char *)0x0)) ||
     (mVar3 = archive_entry_filetype(entry), mVar3 != 0x8000)) {
    archive_entry_set_size(entry,0);
  }
  mVar3 = archive_entry_filetype(entry);
  if (((mVar3 == 0x4000) && (pcVar7 = archive_entry_pathname(entry), pcVar7 != (char *)0x0)) &&
     (sVar8 = strlen(pcVar7), pcVar7[sVar8 - 1] != '/')) {
    todo = 0;
    as.s = (char *)0x0;
    as.length = 0;
    as.buffer_length = strlen(pcVar7);
    paVar9 = archive_string_ensure((archive_string *)&todo,as.buffer_length + 2);
    if (paVar9 == (archive_string *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate ustar data");
      archive_string_free((archive_string *)&todo);
      return -0x1e;
    }
    as.s = (char *)0x0;
    archive_strncat((archive_string *)&todo,pcVar7,as.buffer_length);
    archive_strappend_char((archive_string *)&todo,'/');
    archive_entry_copy_pathname(entry,(char *)todo);
    archive_string_free((archive_string *)&todo);
  }
  wVar4 = _archive_entry_pathname_l
                    (entry,(char **)(plVar1 + 4),(size_t *)(plVar1 + 5),
                     (archive_string_conv *)entry_main);
  if (wVar4 != L'\0') {
    piVar10 = __errno_location();
    if (*piVar10 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Pathame");
      return -0x1e;
    }
    pcVar7 = archive_entry_pathname(entry);
    pcVar11 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error(&a->archive,0x54,"Can\'t translate pathname \'%s\' to %s",pcVar7,pcVar11);
    gnutar._4_4_ = -0x14;
  }
  wVar4 = _archive_entry_uname_l
                    (entry,(char **)(plVar1 + 6),(size_t *)(plVar1 + 7),
                     (archive_string_conv *)entry_main);
  if (wVar4 != L'\0') {
    piVar10 = __errno_location();
    if (*piVar10 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Uname");
      return -0x1e;
    }
    pcVar7 = archive_entry_uname(entry);
    pcVar11 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error(&a->archive,0x54,"Can\'t translate uname \'%s\' to %s",pcVar7,pcVar11);
    gnutar._4_4_ = -0x14;
  }
  wVar4 = _archive_entry_gname_l
                    (entry,(char **)(plVar1 + 8),(size_t *)(plVar1 + 9),
                     (archive_string_conv *)entry_main);
  if (wVar4 != L'\0') {
    piVar10 = __errno_location();
    if (*piVar10 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Gname");
      return -0x1e;
    }
    pcVar7 = archive_entry_gname(entry);
    pcVar11 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error(&a->archive,0x54,"Can\'t translate gname \'%s\' to %s",pcVar7,pcVar11);
    gnutar._4_4_ = -0x14;
  }
  wVar4 = _archive_entry_hardlink_l
                    (entry,(char **)(plVar1 + 2),(size_t *)(plVar1 + 3),
                     (archive_string_conv *)entry_main);
  if (wVar4 != L'\0') {
    piVar10 = __errno_location();
    if (*piVar10 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Linkname");
      return -0x1e;
    }
    pcVar7 = archive_entry_hardlink(entry);
    pcVar11 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar7,pcVar11);
    gnutar._4_4_ = -0x14;
  }
  if ((plVar1[3] == 0) &&
     (wVar4 = _archive_entry_symlink_l
                        (entry,(char **)(plVar1 + 2),(size_t *)(plVar1 + 3),
                         (archive_string_conv *)entry_main), wVar4 != L'\0')) {
    piVar10 = __errno_location();
    if (*piVar10 == 0xc) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory for Linkname");
      return -0x1e;
    }
    pcVar7 = archive_entry_hardlink(entry);
    pcVar11 = archive_string_conversion_charset_name((archive_string_conv *)entry_main);
    archive_set_error(&a->archive,0x54,"Can\'t translate linkname \'%s\' to %s",pcVar7,pcVar11);
    gnutar._4_4_ = -0x14;
  }
  if (100 < (ulong)plVar1[3]) {
    sVar2 = plVar1[3];
    paVar12 = archive_entry_new2(&a->archive);
    archive_entry_set_uname(paVar12,"root");
    archive_entry_set_gname(paVar12,"wheel");
    archive_entry_set_pathname(paVar12,"././@LongLink");
    archive_entry_set_size(paVar12,plVar1[3] + 1);
    iVar5 = archive_format_gnutar_header(a,(char *)&ret,paVar12,0x4b);
    if (iVar5 < -0x14) {
      return iVar5;
    }
    iVar5 = __archive_write_output(a,&ret,0x200);
    if (iVar5 < -0x14) {
      return iVar5;
    }
    archive_entry_free(paVar12);
    iVar5 = __archive_write_output(a,(void *)plVar1[2],sVar2);
    if (iVar5 < -0x14) {
      return iVar5;
    }
    iVar5 = __archive_write_nulls(a,-sVar2 & 0x1ff);
    if (iVar5 < -0x14) {
      return iVar5;
    }
  }
  if (100 < (ulong)plVar1[5]) {
    buff_00 = (void *)plVar1[4];
    sVar2 = plVar1[5];
    paVar12 = archive_entry_new2(&a->archive);
    archive_entry_set_uname(paVar12,"root");
    archive_entry_set_gname(paVar12,"wheel");
    archive_entry_set_pathname(paVar12,"././@LongLink");
    archive_entry_set_size(paVar12,plVar1[5] + 1);
    iVar5 = archive_format_gnutar_header(a,(char *)&ret,paVar12,0x4c);
    if (iVar5 < -0x14) {
      return iVar5;
    }
    iVar5 = __archive_write_output(a,&ret,0x200);
    if (iVar5 < -0x14) {
      return iVar5;
    }
    archive_entry_free(paVar12);
    iVar5 = __archive_write_output(a,buff_00,sVar2);
    if (iVar5 < -0x14) {
      return iVar5;
    }
    iVar5 = __archive_write_nulls(a,-sVar2 & 0x1ff);
    if (iVar5 < -0x14) {
      return iVar5;
    }
  }
  pcVar7 = archive_entry_hardlink(entry);
  if (pcVar7 == (char *)0x0) {
    mVar3 = archive_entry_filetype(entry);
    if (mVar3 == 0x1000) {
      gnutar._0_4_ = 0x36;
    }
    else if (mVar3 == 0x2000) {
      gnutar._0_4_ = 0x33;
    }
    else if (mVar3 == 0x4000) {
      gnutar._0_4_ = 0x35;
    }
    else if (mVar3 == 0x6000) {
      gnutar._0_4_ = 0x34;
    }
    else if (mVar3 == 0x8000) {
      gnutar._0_4_ = 0x30;
    }
    else {
      if (mVar3 != 0xa000) {
        if (mVar3 != 0xc000) {
          mVar3 = archive_entry_mode(entry);
          archive_set_error(&a->archive,0x54,"tar format cannot archive this (mode=0%lo)",
                            (ulong)mVar3);
          return -0x19;
        }
        archive_set_error(&a->archive,0x54,"tar format cannot archive socket");
        return -0x19;
      }
      gnutar._0_4_ = 0x32;
    }
  }
  else {
    gnutar._0_4_ = 0x31;
  }
  tartype = archive_format_gnutar_header(a,(char *)&ret,entry,(int)gnutar);
  iVar5 = tartype;
  if (-0x15 < tartype) {
    if (gnutar._4_4_ < tartype) {
      tartype = gnutar._4_4_;
    }
    iVar5 = __archive_write_output(a,&ret,0x200);
    if (-0x15 < iVar5) {
      if (iVar5 < tartype) {
        tartype = iVar5;
      }
      lVar13 = archive_entry_size(entry);
      *plVar1 = lVar13;
      plVar1[1] = -*plVar1 & 0x1ff;
      iVar5 = tartype;
    }
  }
  tartype = iVar5;
  return tartype;
}

Assistant:

static int
archive_write_gnutar_header(struct archive_write *a,
     struct archive_entry *entry)
{
	char buff[512];
	int r, ret, ret2 = ARCHIVE_OK;
	int tartype;
	struct gnutar *gnutar;
	struct archive_string_conv *sconv;
	struct archive_entry *entry_main;

	gnutar = (struct gnutar *)a->format_data;

	/* Setup default string conversion. */
	if (gnutar->opt_sconv == NULL) {
		if (!gnutar->init_default_conversion) {
			gnutar->sconv_default =
			    archive_string_default_conversion_for_write(
				&(a->archive));
			gnutar->init_default_conversion = 1;
		}
		sconv = gnutar->sconv_default;
	} else
		sconv = gnutar->opt_sconv;

	/* Only regular files (not hardlinks) have data. */
	if (archive_entry_hardlink(entry) != NULL ||
	    archive_entry_symlink(entry) != NULL ||
	    !(archive_entry_filetype(entry) == AE_IFREG))
		archive_entry_set_size(entry, 0);

	if (AE_IFDIR == archive_entry_filetype(entry)) {
		const char *p;
		size_t path_length;
		/*
		 * Ensure a trailing '/'.  Modify the entry so
		 * the client sees the change.
		 */
#if defined(_WIN32) && !defined(__CYGWIN__)
		const wchar_t *wp;

		wp = archive_entry_pathname_w(entry);
		if (wp != NULL && wp[wcslen(wp) -1] != L'/') {
			struct archive_wstring ws;

			archive_string_init(&ws);
			path_length = wcslen(wp);
			if (archive_wstring_ensure(&ws,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_wstring_free(&ws);
				return(ARCHIVE_FATAL);
			}
			/* Should we keep '\' ? */
			if (wp[path_length -1] == L'\\')
				path_length--;
			archive_wstrncpy(&ws, wp, path_length);
			archive_wstrappend_wchar(&ws, L'/');
			archive_entry_copy_pathname_w(entry, ws.s);
			archive_wstring_free(&ws);
			p = NULL;
		} else
#endif
			p = archive_entry_pathname(entry);
		/*
		 * On Windows, this is a backup operation just in
		 * case getting WCS failed. On POSIX, this is a
		 * normal operation.
		 */
		if (p != NULL && p[strlen(p) - 1] != '/') {
			struct archive_string as;

			archive_string_init(&as);
			path_length = strlen(p);
			if (archive_string_ensure(&as,
			    path_length + 2) == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate ustar data");
				archive_string_free(&as);
				return(ARCHIVE_FATAL);
			}
#if defined(_WIN32) && !defined(__CYGWIN__)
			/* NOTE: This might break the pathname
			 * if the current code page is CP932 and
			 * the pathname includes a character '\'
			 * as a part of its multibyte pathname. */
			if (p[strlen(p) -1] == '\\')
				path_length--;
			else
#endif
			archive_strncpy(&as, p, path_length);
			archive_strappend_char(&as, '/');
			archive_entry_copy_pathname(entry, as.s);
			archive_string_free(&as);
		}
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	entry_main = __la_win_entry_in_posix_pathseparator(entry);
	if (entry_main == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate ustar data");
		return(ARCHIVE_FATAL);
	}
	if (entry != entry_main)
		entry = entry_main;
	else
		entry_main = NULL;
#else
	entry_main = NULL;
#endif
	r = archive_entry_pathname_l(entry, &(gnutar->pathname),
	    &(gnutar->pathname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Pathame");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate pathname '%s' to %s",
		    archive_entry_pathname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_uname_l(entry, &(gnutar->uname),
	    &(gnutar->uname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Uname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate uname '%s' to %s",
		    archive_entry_uname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	r = archive_entry_gname_l(entry, &(gnutar->gname),
	    &(gnutar->gname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Gname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate gname '%s' to %s",
		    archive_entry_gname(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}

	/* If linkname is longer than 100 chars we need to add a 'K' header. */
	r = archive_entry_hardlink_l(entry, &(gnutar->linkname),
	    &(gnutar->linkname_length), sconv);
	if (r != 0) {
		if (errno == ENOMEM) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory for Linkname");
			ret = ARCHIVE_FATAL;
			goto exit_write_header;
		}
		archive_set_error(&a->archive,
		    ARCHIVE_ERRNO_FILE_FORMAT,
		    "Can't translate linkname '%s' to %s",
		    archive_entry_hardlink(entry),
		    archive_string_conversion_charset_name(sconv));
		ret2 = ARCHIVE_WARN;
	}
	if (gnutar->linkname_length == 0) {
		r = archive_entry_symlink_l(entry, &(gnutar->linkname),
		    &(gnutar->linkname_length), sconv);
		if (r != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Linkname");
				ret = ARCHIVE_FATAL;
				goto exit_write_header;
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate linkname '%s' to %s",
			    archive_entry_hardlink(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
	}
	if (gnutar->linkname_length > GNUTAR_linkname_size) {
		size_t todo = gnutar->linkname_length;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, gnutar->linkname_length + 1);
		ret = archive_format_gnutar_header(a, buff, temp, 'K');
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		archive_entry_free(temp);
		/* Write as many 512 bytes blocks as needed to write full name. */
		ret = __archive_write_output(a, gnutar->linkname, todo);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)todo));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	/* If pathname is longer than 100 chars we need to add an 'L' header. */
	if (gnutar->pathname_length > GNUTAR_name_size) {
		const char *pathname = gnutar->pathname;
		size_t todo = gnutar->pathname_length;
		struct archive_entry *temp = archive_entry_new2(&a->archive);

		/* Uname/gname here don't really matter since no one reads them;
		 * these are the values that GNU tar happens to use on FreeBSD. */
		archive_entry_set_uname(temp, "root");
		archive_entry_set_gname(temp, "wheel");

		archive_entry_set_pathname(temp, "././@LongLink");
		archive_entry_set_size(temp, gnutar->pathname_length + 1);
		ret = archive_format_gnutar_header(a, buff, temp, 'L');
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_output(a, buff, 512);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		archive_entry_free(temp);
		/* Write as many 512 bytes blocks as needed to write full name. */
		ret = __archive_write_output(a, pathname, todo);
		if(ret < ARCHIVE_WARN)
			goto exit_write_header;
		ret = __archive_write_nulls(a, 0x1ff & (-(ssize_t)todo));
		if (ret < ARCHIVE_WARN)
			goto exit_write_header;
	}

	if (archive_entry_hardlink(entry) != NULL) {
		tartype = '1';
	} else
		switch (archive_entry_filetype(entry)) {
		case AE_IFREG: tartype = '0' ; break;
		case AE_IFLNK: tartype = '2' ; break;
		case AE_IFCHR: tartype = '3' ; break;
		case AE_IFBLK: tartype = '4' ; break;
		case AE_IFDIR: tartype = '5' ; break;
		case AE_IFIFO: tartype = '6' ; break;
		case AE_IFSOCK:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "tar format cannot archive socket");
			ret = ARCHIVE_FAILED;
			goto exit_write_header;
		default:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "tar format cannot archive this (mode=0%lo)",
			    (unsigned long)archive_entry_mode(entry));
			ret = ARCHIVE_FAILED;
			goto exit_write_header;
		}

	ret = archive_format_gnutar_header(a, buff, entry, tartype);
	if (ret < ARCHIVE_WARN)
		goto exit_write_header;
	if (ret2 < ret)
		ret = ret2;
	ret2 = __archive_write_output(a, buff, 512);
	if (ret2 < ARCHIVE_WARN) {
		ret = ret2;
		goto exit_write_header;
	}
	if (ret2 < ret)
		ret = ret2;

	gnutar->entry_bytes_remaining = archive_entry_size(entry);
	gnutar->entry_padding = 0x1ff & (-(int64_t)gnutar->entry_bytes_remaining);
exit_write_header:
	if (entry_main)
		archive_entry_free(entry_main);
	return (ret);
}